

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O0

void __thiscall
sznet::net::Connector::Connector(Connector *this,EventLoop *loop,InetAddress *serverAddr)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  LogLevel LVar4;
  LogStream *pLVar5;
  self *this_00;
  SourceFile file;
  undefined1 local_1010 [12];
  Logger local_1000;
  InetAddress *local_20;
  InetAddress *serverAddr_local;
  EventLoop *loop_local;
  Connector *this_local;
  
  local_20 = serverAddr;
  serverAddr_local = (InetAddress *)loop;
  loop_local = (EventLoop *)this;
  std::enable_shared_from_this<sznet::net::Connector>::enable_shared_from_this
            (&this->super_enable_shared_from_this<sznet::net::Connector>);
  this->m_loop = (EventLoop *)serverAddr_local;
  uVar1 = *(undefined8 *)&local_20->field_0;
  uVar2 = *(undefined8 *)((long)&local_20->field_0 + 8);
  uVar3 = *(undefined8 *)((long)&local_20->field_0 + 0x14);
  *(undefined8 *)((long)&(this->m_serverAddr).field_0 + 0xc) =
       *(undefined8 *)((long)&local_20->field_0 + 0xc);
  *(undefined8 *)((long)&(this->m_serverAddr).field_0 + 0x14) = uVar3;
  *(undefined8 *)&(this->m_serverAddr).field_0 = uVar1;
  *(undefined8 *)((long)&(this->m_serverAddr).field_0 + 8) = uVar2;
  this->m_connect = false;
  this->m_state = kDisconnected;
  std::unique_ptr<sznet::net::Channel,std::default_delete<sznet::net::Channel>>::
  unique_ptr<std::default_delete<sznet::net::Channel>,void>
            ((unique_ptr<sznet::net::Channel,std::default_delete<sznet::net::Channel>> *)
             &this->m_channel);
  std::function<void_(int)>::function(&this->m_newConnectionCallback);
  this->m_retryDelayMs = 500;
  LVar4 = Logger::logLevel();
  if ((int)LVar4 < 2) {
    Logger::SourceFile::SourceFile<100>
              ((SourceFile *)local_1010,
               (char (*) [100])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Connector.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_1010._0_8_;
    file.m_size = local_1010._8_4_;
    Logger::Logger(&local_1000,file,0x19,DEBUG,"Connector");
    pLVar5 = Logger::stream(&local_1000);
    this_00 = LogStream::operator<<(pLVar5,"ctor[");
    pLVar5 = LogStream::operator<<(this_00,this);
    LogStream::operator<<(pLVar5,"]");
    Logger::~Logger(&local_1000);
  }
  return;
}

Assistant:

Connector::Connector(EventLoop* loop, const InetAddress& serverAddr): 
	m_loop(loop),
	m_serverAddr(serverAddr),
	m_connect(false),
	m_state(kDisconnected),
	m_retryDelayMs(kInitRetryDelayMs)
{
	LOG_DEBUG << "ctor[" << this << "]";
}